

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line.c
# Opt level: O0

int dwarf_srclines_files_indexes
              (Dwarf_Line_Context line_context,Dwarf_Signed *baseindex,Dwarf_Signed *file_count,
              Dwarf_Signed *endindex,Dwarf_Error *error)

{
  Dwarf_Unsigned DVar1;
  Dwarf_Unsigned DVar2;
  Dwarf_Signed ei;
  Dwarf_Signed fc;
  Dwarf_Signed bi;
  Dwarf_Error *error_local;
  Dwarf_Signed *endindex_local;
  Dwarf_Signed *file_count_local;
  Dwarf_Signed *baseindex_local;
  Dwarf_Line_Context line_context_local;
  
  if (line_context->lc_magic == 0xd00d1111) {
    DVar1 = line_context->lc_file_entry_count;
    DVar2 = line_context->lc_file_entry_endindex;
    if ((long)line_context->lc_file_entry_baseindex < 0) {
      _dwarf_error_string(line_context->lc_dbg,error,499,
                          "DW_DLE_LINE_INDEX_WRONG Call to dwarf_srclines_subprog_data finds an Impossible file entry index value"
                         );
      line_context_local._4_4_ = 1;
    }
    else if ((long)DVar1 < 0) {
      _dwarf_error_string(line_context->lc_dbg,error,500,
                          "DW_DLE_LINE_COUNT_WRONG Call to dwarf_srclines_subprog_data finds an Impossible file count index value"
                         );
      line_context_local._4_4_ = 1;
    }
    else if ((long)DVar2 < 0) {
      _dwarf_error_string(line_context->lc_dbg,error,499,
                          "DW_DLE_LINE_INDEX_WRONG Call to dwarf_srclines_subprog_data finds an Impossible endindex value"
                         );
      line_context_local._4_4_ = 1;
    }
    else {
      *baseindex = line_context->lc_file_entry_baseindex;
      *file_count = DVar1;
      *endindex = DVar2;
      line_context_local._4_4_ = 0;
    }
  }
  else {
    _dwarf_error((Dwarf_Debug)0x0,error,0x131);
    line_context_local._4_4_ = 1;
  }
  return line_context_local._4_4_;
}

Assistant:

int
dwarf_srclines_files_indexes(Dwarf_Line_Context line_context,
    Dwarf_Signed   *baseindex,
    Dwarf_Signed   *file_count,
    Dwarf_Signed   *endindex,
    Dwarf_Error    * error)
{
    if (line_context->lc_magic != DW_CONTEXT_MAGIC) {
        _dwarf_error(NULL, error, DW_DLE_LINE_CONTEXT_BOTCH);
        return DW_DLV_ERROR;
    }
    {
        Dwarf_Signed bi =
            (Dwarf_Signed)line_context->lc_file_entry_baseindex;
        Dwarf_Signed fc =
            (Dwarf_Signed)line_context->lc_file_entry_count;
        Dwarf_Signed ei =
            (Dwarf_Signed)line_context->lc_file_entry_endindex;
        if (bi < 0) {
            _dwarf_error_string(line_context->lc_dbg,error,
                DW_DLE_LINE_INDEX_WRONG,
                "DW_DLE_LINE_INDEX_WRONG "
                "Call to dwarf_srclines_subprog_data "
                "finds an Impossible "
                "file entry index value");
            return DW_DLV_ERROR;
        }
        if (fc < 0) {
            _dwarf_error_string(line_context->lc_dbg,error,
                DW_DLE_LINE_COUNT_WRONG,
                "DW_DLE_LINE_COUNT_WRONG "
                "Call to dwarf_srclines_subprog_data "
                "finds an Impossible "
                "file count index value");
            return DW_DLV_ERROR;
        }
        if (ei < 0) {
            _dwarf_error_string(line_context->lc_dbg,error,
                DW_DLE_LINE_INDEX_WRONG,
                "DW_DLE_LINE_INDEX_WRONG "
                "Call to dwarf_srclines_subprog_data "
                "finds an Impossible "
                "endindex value");
            return DW_DLV_ERROR;
        }
        *baseindex  = bi;
        *file_count = fc;
        *endindex   = ei;
    }
    return DW_DLV_OK;
}